

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

void VW::read_line_json<true>
               (vw *all,v_array<example_*> *examples,char *line,example_factory_t example_factory,
               void *ex_factory_context)

{
  Context<true> *this;
  GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this_00;
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  vw_exception *this_01;
  ParseResult PVar4;
  string local_210 [32];
  string local_1f0;
  InsituStringStream ss;
  stringstream __msg;
  ostream local_1a8;
  
  ss.dst_ = (Ch *)0x0;
  this_00 = (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
            (all->p->jsonp).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this = (Context<true> *)(this_00 + 0x40);
  ss.src_ = line;
  ss.head_ = line;
  strlen(line);
  VWReaderHandler<true>::init((VWReaderHandler<true> *)this,(EVP_PKEY_CTX *)all);
  PVar4 = rapidjson::
          GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
          Parse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                    (this_00,&ss,(VWReaderHandler<true> *)this);
  if (PVar4.code_ == kParseErrorNone) {
    return;
  }
  lVar1 = *(long *)(this_00 + 0x60);
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  poVar2 = std::operator<<(&local_1a8,"JSON parser error at ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,": ");
  pcVar3 = rapidjson::GetParseError_En(PVar4.code_);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,". Handler: ");
  Context<true>::error_abi_cxx11_(this);
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<(poVar2,local_210);
  poVar2 = std::operator<<(poVar2,"State: ");
  if (lVar1 == 0) {
    pcVar3 = "null";
  }
  else {
    pcVar3 = *(char **)(lVar1 + 8);
  }
  std::operator<<(poVar2,pcVar3);
  std::__cxx11::string::~string(local_210);
  this_01 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  vw_exception::vw_exception
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_example_json.h"
             ,0x474,&local_1f0);
  __cxa_throw(this_01,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void read_line_json(
    vw& all, v_array<example*>& examples, char* line, example_factory_t example_factory, void* ex_factory_context)
{
  // string line_copy(line);
  // destructive parsing
  InsituStringStream ss(line);
  json_parser<audit>* parser = static_cast<json_parser<audit>*>(all.p->jsonp.get());

  VWReaderHandler<audit>& handler = parser->handler;
  handler.init(&all, &examples, &ss, line + strlen(line), example_factory, ex_factory_context);

  ParseResult result =
      parser->reader.template Parse<kParseInsituFlag, InsituStringStream, VWReaderHandler<audit>>(ss, handler);
  if (!result.IsError())
    return;

  BaseState<audit>* current_state = handler.current_state();

  THROW("JSON parser error at " << result.Offset() << ": " << GetParseError_En(result.Code())
                                << ". "
                                   "Handler: "
                                << handler.error().str()
                                << "State: " << (current_state ? current_state->name : "null"));  // <<
  // "Line: '"<< line_copy << "'");
}